

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O3

DWORD SleepEx(DWORD dwMilliseconds,BOOL bAlertable)

{
  PAL_ERROR PVar1;
  CPalThread *pThread;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    PVar1 = CorUnix::InternalSleepEx(pThread,dwMilliseconds,bAlertable);
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
  abort();
}

Assistant:

DWORD
PALAPI
SleepEx(IN DWORD dwMilliseconds,
        IN BOOL bAlertable)
{
    DWORD dwRet;

    PERF_ENTRY(SleepEx);
    ENTRY("SleepEx(dwMilliseconds=%u, bAlertable=%d)\n", dwMilliseconds, bAlertable);

    CPalThread * pThread = InternalGetCurrentThread();

    dwRet = InternalSleepEx(pThread, dwMilliseconds, bAlertable);

    LOGEXIT("SleepEx returns DWORD %u\n", dwRet);
    PERF_EXIT(SleepEx);

    return dwRet;
}